

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O3

Address wasm::anon_unknown_0::getExportedAddress(Module *wasm,Export *export_)

{
  Global *pGVar1;
  Address AVar2;
  char *pcVar3;
  variant<wasm::Name,_wasm::HeapType> *pvVar4;
  size_t sVar5;
  Expression *pEVar6;
  Name name;
  
  sVar5 = 0;
  pcVar3 = (char *)0x0;
  if (export_->kind == Global) {
    pvVar4 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
    if (*(__index_type *)
         ((long)&(export_->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) == '\0') {
      pvVar4 = &export_->value;
    }
    sVar5 = *(size_t *)
             &(pvVar4->super__Variant_base<wasm::Name,_wasm::HeapType>).
              super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
              super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
              super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
              super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
              super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
    pcVar3 = *(char **)((long)&(pvVar4->super__Variant_base<wasm::Name,_wasm::HeapType>).
                               super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                               super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                               super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                               super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                               super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u + 8);
  }
  name.super_IString.str._M_str = pcVar3;
  name.super_IString.str._M_len = sVar5;
  pGVar1 = Module::getGlobal(wasm,name);
  pEVar6 = (Expression *)0x0;
  if (pGVar1->init->_id == ConstId) {
    pEVar6 = pGVar1->init;
  }
  AVar2.addr = Literal::getUnsigned((Literal *)(pEVar6 + 1));
  return (Address)AVar2.addr;
}

Assistant:

static Address getExportedAddress(Module& wasm, Export* export_) {
  Global* g = wasm.getGlobal((export_->kind == ExternalKind::Global)
                               ? *export_->getInternalName()
                               : Name());
  auto* addrConst = g->init->dynCast<Const>();
  return addrConst->value.getUnsigned();
}